

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

Layer * ncnn::Convolution_x86_layer_creator(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x2f0);
  Convolution::Convolution((Convolution *)(puVar1 + 0x16));
  *puVar1 = 0x189ba8;
  puVar1[0x16] = 0x189c38;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  puVar1[1] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  *(undefined8 *)((long)puVar1 + 100) = 0;
  *(undefined8 *)((long)puVar1 + 0x6c) = 0;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0;
  return &((Convolution *)(puVar1 + 0x16))->super_Layer;
}

Assistant:

Convolution_x86::Convolution_x86()
{
    activation = 0;
}